

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensors.cpp
# Opt level: O2

ConstIterator * __thiscall
iDynTree::SensorsList::ConstIterator::operator++
          (ConstIterator *__return_storage_ptr__,ConstIterator *this,int param_1)

{
  vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_> *pvVar1;
  
  __return_storage_ptr__->iteratingList = this->iteratingList;
  pvVar1 = (this->externalIterator)._M_current;
  (__return_storage_ptr__->internalIterator)._M_current = (this->internalIterator)._M_current;
  (__return_storage_ptr__->externalIterator)._M_current = pvVar1;
  operator++(this);
  return __return_storage_ptr__;
}

Assistant:

SensorsList::ConstIterator SensorsList::ConstIterator::operator++(int)
    {
        SensorsList::ConstIterator previous(*this);
        this->operator++();
        return previous;
    }